

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

int SaveEnv(void)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar5;
  size_type sVar6;
  reference pvVar7;
  interval *piVar8;
  int local_42c;
  char local_428 [4];
  int i;
  char line [1024];
  FILE *fileout;
  FILE *filein;
  
  memset(local_428,0,0x400);
  __stream = fopen("env.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("Error saving configuration file.\n");
    filein._4_4_ = 1;
  }
  else {
    __stream_00 = fopen("~env.txt","w");
    if (__stream_00 == (FILE *)0x0) {
      printf("Error saving configuration file.\n");
      fclose(__stream);
      filein._4_4_ = 1;
    }
    else {
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",
                      ((1.5707963267948966 - angle_env) * 180.0) / 3.141592653589793);
      if (iVar4 < 0) {
        printf("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : lat_env.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",lat_env);
      if (iVar4 < 0) {
        printf("Error writing parameter : lat_env.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : long_env.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",long_env);
      if (iVar4 < 0) {
        printf("Error writing parameter : long_env.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : alt_env.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",alt_env);
      if (iVar4 < 0) {
        printf("Error writing parameter : alt_env.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : MagneticDeclination.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",MagneticDeclination);
      if (iVar4 < 0) {
        printf("Error writing parameter : MagneticDeclination.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : AirPressure.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",AirPressure);
      if (iVar4 < 0) {
        printf("Error writing parameter : AirPressure.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : WaterVelocityOfSound.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",WaterVelocityOfSound);
      if (iVar4 < 0) {
        printf("Error writing parameter : WaterVelocityOfSound.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : WaterFloorAltitude.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",WaterFloorAltitude);
      if (iVar4 < 0) {
        printf("Error writing parameter : WaterFloorAltitude.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : (int)circles_r.size().\n");
      }
      sVar6 = std::vector<double,_std::allocator<double>_>::size(&circles_r);
      iVar4 = fprintf(__stream_00,"%d\n",sVar6 & 0xffffffff);
      if (iVar4 < 0) {
        printf("Error writing parameter : (int)circles_r.size().\n");
      }
      local_42c = 0;
      while( true ) {
        sVar6 = std::vector<double,_std::allocator<double>_>::size(&circles_r);
        if ((int)sVar6 <= local_42c) break;
        pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
        if (pcVar5 == (char *)0x0) {
          printf("Invalid parameter : circles.\n");
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&circles_x,(long)local_42c);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&circles_y,(long)local_42c);
        vVar2 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&circles_r,(long)local_42c);
        iVar4 = fprintf(__stream_00,"%.10g %.10g %.10g\n",vVar1,vVar2,*pvVar7);
        if (iVar4 < 0) {
          printf("Error writing parameter : circles.\n");
        }
        local_42c = local_42c + 1;
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : (int)walls_xa.size().\n");
      }
      sVar6 = std::vector<double,_std::allocator<double>_>::size(&walls_xa);
      iVar4 = fprintf(__stream_00,"%d\n",sVar6 & 0xffffffff);
      if (iVar4 < 0) {
        printf("Error writing parameter : (int)walls_xa.size().\n");
      }
      local_42c = 0;
      while( true ) {
        sVar6 = std::vector<double,_std::allocator<double>_>::size(&walls_xa);
        if ((int)sVar6 <= local_42c) break;
        pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
        if (pcVar5 == (char *)0x0) {
          printf("Invalid parameter : walls.\n");
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xa,(long)local_42c)
        ;
        vVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&walls_ya,(long)local_42c)
        ;
        vVar2 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xb,(long)local_42c)
        ;
        vVar3 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&walls_yb,(long)local_42c)
        ;
        iVar4 = fprintf(__stream_00,"%.10g %.10g %.10g %.10g\n",vVar1,vVar2,vVar3,*pvVar7);
        if (iVar4 < 0) {
          printf("Error writing parameter : walls.\n");
        }
        local_42c = local_42c + 1;
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : box_env[0].inf.\n");
      }
      piVar8 = box::operator[](&box_env,0);
      iVar4 = fprintf(__stream_00,"%.10g\n",piVar8->inf);
      if (iVar4 < 0) {
        printf("Error writing parameter : box_env[0].inf.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : box_env[0].sup.\n");
      }
      piVar8 = box::operator[](&box_env,0);
      iVar4 = fprintf(__stream_00,"%.10g\n",piVar8->sup);
      if (iVar4 < 0) {
        printf("Error writing parameter : box_env[0].sup.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : box_env[1].inf.\n");
      }
      piVar8 = box::operator[](&box_env,1);
      iVar4 = fprintf(__stream_00,"%.10g\n",piVar8->inf);
      if (iVar4 < 0) {
        printf("Error writing parameter : box_env[1].inf.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : box_env[1].sup.\n");
      }
      piVar8 = box::operator[](&box_env,1);
      iVar4 = fprintf(__stream_00,"%.10g\n",piVar8->sup);
      if (iVar4 < 0) {
        printf("Error writing parameter : box_env[1].sup.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : csMap.xMin.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar4 < 0) {
        printf("Error writing parameter : csMap.xMin.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : csMap.xMax.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar4 < 0) {
        printf("Error writing parameter : csMap.xMax.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : csMap.xMin.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar4 < 0) {
        printf("Error writing parameter : csMap.xMin.\n");
      }
      pcVar5 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,local_428,0x400);
      if (pcVar5 == (char *)0x0) {
        printf("Invalid parameter : csMap.xMax.\n");
      }
      iVar4 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar4 < 0) {
        printf("Error writing parameter : csMap.xMax.\n");
      }
      iVar4 = fclose(__stream_00);
      if (iVar4 == 0) {
        iVar4 = fclose(__stream);
        if (iVar4 == 0) {
          iVar4 = remove("env.txt");
          if (iVar4 == 0) {
            iVar4 = rename("~env.txt","env.txt");
            if (iVar4 == 0) {
              filein._4_4_ = 0;
            }
            else {
              printf("Error saving configuration file.\n");
              filein._4_4_ = 1;
            }
          }
          else {
            printf("Error saving configuration file.\n");
            filein._4_4_ = 1;
          }
        }
        else {
          printf("Error saving configuration file.\n");
          filein._4_4_ = 1;
        }
      }
      else {
        printf("Error saving configuration file.\n");
        fclose(__stream);
        filein._4_4_ = 1;
      }
    }
  }
  return filein._4_4_;
}

Assistant:

inline int SaveEnv(void)
{
	FILE* filein = NULL;
	FILE* fileout = NULL;
	char line[1024];
	int i = 0;

	// Missing error checking...

	memset(line, 0, sizeof(line));

	filein = fopen("env.txt", "r");
	if (filein == NULL)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	fileout = fopen("~env.txt", "w");
	if (fileout == NULL)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");
	if (fprintf(fileout, "%.10g\n", (M_PI/2.0-angle_env)*180.0/M_PI) < 0) printf("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : lat_env.\n");
	if (fprintf(fileout, "%.10g\n", lat_env) < 0) printf("Error writing parameter : lat_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : long_env.\n");
	if (fprintf(fileout, "%.10g\n", long_env) < 0) printf("Error writing parameter : long_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : alt_env.\n");
	if (fprintf(fileout, "%.10g\n", alt_env) < 0) printf("Error writing parameter : alt_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : MagneticDeclination.\n");
	if (fprintf(fileout, "%.10g\n", MagneticDeclination) < 0) printf("Error writing parameter : MagneticDeclination.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : AirPressure.\n");
	if (fprintf(fileout, "%.10g\n", AirPressure) < 0) printf("Error writing parameter : AirPressure.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterVelocityOfSound.\n");
	if (fprintf(fileout, "%.10g\n", WaterVelocityOfSound) < 0) printf("Error writing parameter : WaterVelocityOfSound.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterFloorAltitude.\n");
	if (fprintf(fileout, "%.10g\n", WaterFloorAltitude) < 0) printf("Error writing parameter : WaterFloorAltitude.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)circles_r.size().\n");
	if (fprintf(fileout, "%d\n", (int)circles_r.size()) < 0) printf("Error writing parameter : (int)circles_r.size().\n");
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : circles.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g\n", circles_x[i], circles_y[i], circles_r[i]) < 0) printf("Error writing parameter : circles.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)walls_xa.size().\n");
	if (fprintf(fileout, "%d\n", (int)walls_xa.size()) < 0) printf("Error writing parameter : (int)walls_xa.size().\n");
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : walls.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g %.10g\n", walls_xa[i], walls_ya[i], walls_xb[i], walls_yb[i]) < 0) printf("Error writing parameter : walls.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].inf) < 0) printf("Error writing parameter : box_env[0].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].sup) < 0) printf("Error writing parameter : box_env[0].sup.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].inf) < 0) printf("Error writing parameter : box_env[1].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].sup) < 0) printf("Error writing parameter : box_env[1].sup.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");

	if (fclose(fileout) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}
	if (fclose(filein) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	if (remove("env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	if (rename("~env.txt", "env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}